

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Reader::PerformGets(BP5Reader *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  ulong uVar5;
  char *pcVar6;
  string *message;
  type pRVar7;
  long in_RDI;
  BP5Reader *in_stack_00000040;
  int localPort;
  string RemoteName;
  bool RowMajorOrdering;
  string *in_stack_000009a0;
  Remote *in_stack_000009a8;
  pointer in_stack_fffffffffffffd48;
  EVPathRemote *in_stack_fffffffffffffd50;
  allocator *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd90;
  int commRank;
  string *activity;
  undefined4 in_stack_fffffffffffffda8;
  string *component;
  string local_228 [32];
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  undefined1 local_1b9 [40];
  allocator local_191;
  string local_190 [32];
  string local_170 [32];
  string local_150 [39];
  allocator local_129;
  string local_128 [24];
  BP5Reader *in_stack_fffffffffffffef0;
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [39];
  undefined1 local_91 [33];
  string local_70 [36];
  int local_4c;
  undefined1 local_48 [63];
  byte local_9;
  
  if (((*(byte *)(in_RDI + 0x458) & 1) != 0) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                         0xa5ed50), !bVar1)) {
    local_9 = *(int *)(*(long *)(in_RDI + 0x28) + 0x58) == 0;
    sVar4 = std::
            vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
            ::size((vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                    *)(*(long *)(in_RDI + 0x290) + 0x18));
    if (sVar4 == 0) {
      return;
    }
    std::__cxx11::string::string((string *)(local_48 + 0x18));
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=((string *)(local_48 + 0x18),(string *)(in_RDI + 0x228));
    }
    else {
      pcVar6 = getenv("DoRemote");
      if ((pcVar6 != (char *)0x0) || (pcVar6 = getenv("DoXRootD"), pcVar6 != (char *)0x0)) {
        std::__cxx11::string::operator=((string *)(local_48 + 0x18),(string *)(in_RDI + 0x30));
      }
    }
    operator_new(0x140);
    EVPathRemote::EVPathRemote(in_stack_fffffffffffffd50,(HostOptions *)in_stack_fffffffffffffd48);
    component = (string *)local_48;
    std::unique_ptr<adios2::EVPathRemote,std::default_delete<adios2::EVPathRemote>>::
    unique_ptr<std::default_delete<adios2::EVPathRemote>,void>
              ((unique_ptr<adios2::EVPathRemote,_std::default_delete<adios2::EVPathRemote>_> *)
               in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::unique_ptr<adios2::Remote,std::default_delete<adios2::Remote>>::operator=
              (in_stack_fffffffffffffd60,
               (unique_ptr<adios2::EVPathRemote,_std::default_delete<adios2::EVPathRemote>_> *)
               in_stack_fffffffffffffd58);
    std::unique_ptr<adios2::EVPathRemote,_std::default_delete<adios2::EVPathRemote>_>::~unique_ptr
              ((unique_ptr<adios2::EVPathRemote,_std::default_delete<adios2::EVPathRemote>_> *)
               in_stack_fffffffffffffd50);
    std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::operator->
              ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)0xa5eeba);
    std::__cxx11::string::string(local_70,(string *)(in_RDI + 0x248));
    iVar2 = Remote::LaunchRemoteServerViaConnectionManager(in_stack_000009a8,in_stack_000009a0);
    std::__cxx11::string::~string(local_70);
    local_4c = iVar2;
    message = (string *)
              std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::operator->
                        ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                         0xa5ef21);
    activity = (string *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_91 + 1),"localhost",(allocator *)activity);
    commRank = local_4c;
    std::__cxx11::string::string(local_b8,(string *)(local_48 + 0x18));
    (**(code **)(*(long *)message + 0x18))
              (message,local_91 + 1,commRank,local_b8,*(undefined4 *)(in_RDI + 0x50),local_9 & 1);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    bVar1 = std::operator==((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                            in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"Engine",&local_d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"BP5Reader",&local_101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"OpenFiles",&local_129);
      std::operator+((char *)message,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(commRank,in_stack_fffffffffffffd90));
      std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (component,(string *)CONCAT44(iVar2,in_stack_fffffffffffffda8),activity,message,
                 commRank);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    pRVar7 = std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::operator*
                       ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                        in_stack_fffffffffffffd50);
    uVar3 = (*pRVar7->_vptr_Remote[2])();
    if ((uVar3 & 1) == 0) {
      paVar8 = &local_191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"Engine",paVar8);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_1b9 + 1),"BP5Reader",(allocator *)__lhs);
      paVar8 = &local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,"OpenFiles",paVar8);
      std::operator+((char *)message,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(commRank,in_stack_fffffffffffffd90));
      std::operator+(__lhs,(char *)paVar8);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (component,(string *)CONCAT44(iVar2,in_stack_fffffffffffffda8),activity,message,
                 commRank);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      std::__cxx11::string::~string((string *)(local_1b9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1b9);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
    std::__cxx11::string::~string((string *)(local_48 + 0x18));
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)0xa5f5ca);
  if (bVar1) {
    PerformRemoteGets(in_stack_fffffffffffffef0);
  }
  else {
    PerformLocalGets(in_stack_00000040);
  }
  adios2::format::BP5Deserializer::ClearGetState((BP5Deserializer *)0xa5f600);
  return;
}

Assistant:

void BP5Reader::PerformGets()
{
    // if dataIsRemote is true and m_Remote is not true, this is our first time through
    // PerformGets() Either we don't need a remote open (m_dataIsRemote=false), or we need to Open
    // remote file (or die trying)
    if (m_dataIsRemote && !m_Remote)
    {
        bool RowMajorOrdering = (m_IO.m_ArrayOrder == ArrayOrdering::RowMajor);

        // If nothing is pending, don't open
        if (m_BP5Deserializer->PendingGetRequests.size() == 0)
            return;

        std::string RemoteName;
        if (!m_Parameters.RemoteDataPath.empty())
        {
            RemoteName = m_Parameters.RemoteDataPath;
        }
        else if (getenv("DoRemote") || getenv("DoXRootD"))
        {
            RemoteName = m_Name;
        }
        (void)RowMajorOrdering; // Use in case no remotes available
#ifdef ADIOS2_HAVE_XROOTD
        if (getenv("DoXRootD"))
        {
            m_Remote = std::unique_ptr<XrootdRemote>(new XrootdRemote(m_HostOptions));
            m_Remote->Open("localhost", 1094, m_Name, m_OpenMode, RowMajorOrdering);
        }
        else
#endif
#ifdef ADIOS2_HAVE_SST
        {
            m_Remote = std::unique_ptr<EVPathRemote>(new EVPathRemote(m_HostOptions));
            int localPort =
                m_Remote->LaunchRemoteServerViaConnectionManager(m_Parameters.RemoteHost);
            m_Remote->Open("localhost", localPort, RemoteName, m_OpenMode, RowMajorOrdering);
        }
#endif
#ifdef ADIOS2_HAVE_KVCACHE
        if (getenv("useKVCache"))
        {
            m_KVCache.OpenConnection();
            m_Fingerprint = m_Parameters.UUID;
            if (m_Fingerprint.empty())
            {
                m_KVCache.RemotePathHashMd5(RemoteName, m_Fingerprint);
            }
            m_KVCache.SetLocalCacheFile(m_Name + PathSeparator + "data");
        }
#endif
        if (m_Remote == nullptr)
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP5Reader", "OpenFiles",
                "Remote file " + m_Name +
                    " cannot be opened. Possible server or file specification error.");
        }
        if (!(*m_Remote)) // evaluate validity of object, not just that the pointer is non-NULL
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP5Reader", "OpenFiles",
                "Remote file " + m_Name +
                    " cannot be opened. Possible server or file specification error.");
        }
    }

    if (m_Remote)
    {
#ifdef ADIOS2_HAVE_KVCACHE
        if (getenv("useKVCache"))
        {
            PerformRemoteGetsWithKVCache();
        }
        else
        {
            PerformRemoteGets();
        }
#else
        PerformRemoteGets();
#endif
    }
    else
    {
        PerformLocalGets();
    }

    // clear pending requests inside deserializer
    m_BP5Deserializer->ClearGetState();
}